

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

uint Validator::constraintS2(Solution *solution)

{
  pointer ppTVar1;
  pointer ppTVar2;
  Turn *this;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar8;
  Scenario *pSVar9;
  Nurse *pNVar10;
  string *psVar11;
  History *pHVar12;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar13;
  ShiftType *pSVar14;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *pmVar15;
  mapped_type *pmVar16;
  long lVar17;
  _Base_ptr p_Var18;
  uint uVar19;
  long local_e8;
  string lastShift;
  Contract contract;
  string local_50;
  
  pmVar8 = Solution::getNurses_abi_cxx11_(solution);
  p_Var18 = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar19 = 0;
  do {
    if ((_Rb_tree_header *)p_Var18 == &(pmVar8->_M_t)._M_impl.super__Rb_tree_header) {
      return uVar19;
    }
    pSVar9 = Scenario::getInstance();
    pNVar10 = NurseSolution::getNurse(*(NurseSolution **)(p_Var18 + 2));
    psVar11 = Nurse::getContract_abi_cxx11_(pNVar10);
    std::__cxx11::string::string((string *)&local_50,(string *)psVar11);
    Scenario::getContract(&contract,pSVar9,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pNVar10 = NurseSolution::getNurse(*(NurseSolution **)(p_Var18 + 2));
    pHVar12 = Nurse::getHistory(pNVar10);
    iVar4 = History::getNumberOfConsecutiveAssignments(pHVar12);
    pNVar10 = NurseSolution::getNurse(*(NurseSolution **)(p_Var18 + 2));
    pHVar12 = Nurse::getHistory(pNVar10);
    iVar5 = History::getNumberOfConsecutiveWorkingDays(pHVar12);
    pNVar10 = NurseSolution::getNurse(*(NurseSolution **)(p_Var18 + 2));
    pHVar12 = Nurse::getHistory(pNVar10);
    psVar11 = History::getLastAssignedShiftType_abi_cxx11_(pHVar12);
    std::__cxx11::string::string((string *)&lastShift,(string *)psVar11);
    pvVar13 = NurseSolution::getTurns(*(NurseSolution **)(p_Var18 + 2));
    ppTVar1 = (pvVar13->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppTVar2 = (pvVar13->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    lVar17 = 0;
    local_e8 = 1;
    iVar7 = -1;
    while( true ) {
      if ((pointer)(lVar17 + (long)ppTVar1) == ppTVar2) break;
      this = ppTVar1[local_e8 + -1];
      bVar3 = std::operator==(&lastShift,"None");
      iVar6 = 1;
      if (bVar3) {
LAB_00111336:
        iVar5 = iVar6;
        bVar3 = std::operator==(&lastShift,"None");
        if (!bVar3) {
          pSVar14 = Turn::getShiftType(this);
          psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
          bVar3 = std::operator!=(&lastShift,psVar11);
          if (!bVar3) {
            iVar4 = iVar4 + 1;
            goto LAB_001115ba;
          }
          pSVar9 = Scenario::getInstance();
          pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
          pSVar14 = Turn::getShiftType(this);
          psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                    ::at(pmVar15,psVar11);
          iVar7 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar16);
          if (iVar4 < iVar7) {
            pSVar9 = Scenario::getInstance();
            pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
            pSVar14 = Turn::getShiftType(this);
            psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar15,psVar11);
            iVar7 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar16);
            iVar7 = iVar7 - iVar4;
          }
          else {
            pSVar9 = Scenario::getInstance();
            pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
            pSVar14 = Turn::getShiftType(this);
            psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar15,psVar11);
            iVar7 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar16);
            if (iVar5 <= iVar7) goto LAB_001115b4;
            pSVar9 = Scenario::getInstance();
            pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
            pSVar14 = Turn::getShiftType(this);
            psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar15,psVar11);
            iVar7 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar16);
            iVar7 = iVar4 - iVar7;
          }
          uVar19 = uVar19 + iVar7 * 0xf;
        }
LAB_001115b4:
        iVar4 = 1;
      }
      else {
        iVar6 = Turn::getDay(this);
        if (iVar6 == iVar7 + 1) {
          iVar6 = iVar5 + 1;
          goto LAB_00111336;
        }
        iVar7 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&contract);
        if (iVar5 < iVar7) {
          iVar7 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&contract);
          iVar7 = iVar7 - iVar5;
LAB_00111433:
          uVar19 = uVar19 + iVar7 * 0x1e;
        }
        else {
          iVar7 = Contract::getMaximumNumberOfConsecutiveWorkingDays(&contract);
          if (iVar7 < iVar5) {
            iVar7 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&contract);
            iVar7 = iVar5 - iVar7;
            goto LAB_00111433;
          }
        }
        pSVar9 = Scenario::getInstance();
        pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
        pSVar14 = Turn::getShiftType(this);
        psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                  ::at(pmVar15,psVar11);
        iVar7 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar16);
        if (iVar4 < iVar7) {
          pSVar9 = Scenario::getInstance();
          pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
          pSVar14 = Turn::getShiftType(this);
          psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                    ::at(pmVar15,psVar11);
          iVar7 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar16);
          iVar7 = iVar7 - iVar4;
LAB_0011151f:
          uVar19 = uVar19 + iVar7 * 0xf;
        }
        else {
          pSVar9 = Scenario::getInstance();
          pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
          pSVar14 = Turn::getShiftType(this);
          psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                    ::at(pmVar15,psVar11);
          iVar7 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar16);
          if (iVar7 < iVar5) {
            pSVar9 = Scenario::getInstance();
            pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
            pSVar14 = Turn::getShiftType(this);
            psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar15,psVar11);
            iVar7 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar16);
            iVar7 = iVar4 - iVar7;
            goto LAB_0011151f;
          }
        }
        iVar4 = 1;
        iVar5 = 1;
      }
LAB_001115ba:
      pSVar14 = Turn::getShiftType(this);
      ShiftType::getId_abi_cxx11_(pSVar14);
      std::__cxx11::string::_M_assign((string *)&lastShift);
      iVar7 = Turn::getDay(this);
      pvVar13 = NurseSolution::getTurns(*(NurseSolution **)(p_Var18 + 2));
      if (local_e8 ==
          (long)(pvVar13->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar13->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3) {
        iVar6 = Turn::getDay(this);
        if (iVar6 != 6) {
          iVar6 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&contract);
          if (iVar5 < iVar6) {
            iVar6 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&contract);
            iVar6 = iVar6 - iVar5;
LAB_00111655:
            uVar19 = uVar19 + iVar6 * 0x1e;
          }
          else {
            iVar6 = Contract::getMaximumNumberOfConsecutiveWorkingDays(&contract);
            if (iVar6 < iVar5) {
              iVar6 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&contract);
              iVar6 = iVar5 - iVar6;
              goto LAB_00111655;
            }
          }
          pSVar9 = Scenario::getInstance();
          pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
          pSVar14 = Turn::getShiftType(this);
          psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                    ::at(pmVar15,psVar11);
          iVar6 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar16);
          if (iVar4 < iVar6) {
            pSVar9 = Scenario::getInstance();
            pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
            pSVar14 = Turn::getShiftType(this);
            psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar15,psVar11);
            iVar6 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar16);
            iVar6 = iVar6 - iVar4;
          }
          else {
            pSVar9 = Scenario::getInstance();
            pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
            pSVar14 = Turn::getShiftType(this);
            psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar15,psVar11);
            iVar6 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar16);
            if (iVar5 <= iVar6) goto LAB_00111752;
            pSVar9 = Scenario::getInstance();
            pmVar15 = Scenario::getShifts_abi_cxx11_(pSVar9);
            pSVar14 = Turn::getShiftType(this);
            psVar11 = ShiftType::getId_abi_cxx11_(pSVar14);
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar15,psVar11);
            iVar6 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar16);
            iVar6 = iVar4 - iVar6;
          }
          uVar19 = uVar19 + iVar6 * 0xf;
        }
      }
LAB_00111752:
      local_e8 = local_e8 + 1;
      lVar17 = lVar17 + 8;
    }
    std::__cxx11::string::~string((string *)&lastShift);
    std::__cxx11::string::~string((string *)&contract);
    p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
  } while( true );
}

Assistant:

unsigned int Validator::constraintS2(const Solution &solution){

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
        {
            Contract contract = Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract());

            int numberOfConsecutiveAssignments = nurse.second->getNurse()->getHistory().getNumberOfConsecutiveAssignments();

            int numberOfConsecutiveWorkingDays = nurse.second->getNurse()->getHistory().getNumberOfConsecutiveWorkingDays();

            string lastShift = nurse.second->getNurse()->getHistory().getLastAssignedShiftType();

            int day = -1;
            bool done = false;

            //iterate turns
            int turnN = 0;
            for(Turn * turn : nurse.second->getTurns())
            {
                if(lastShift == "None")
                    numberOfConsecutiveWorkingDays = 1;
                //if it stops being consecutive working days
                else if(turn->getDay() != day + 1) {
                    if (numberOfConsecutiveWorkingDays < contract.getMinimumNumberOfConsecutiveWorkingDays())
                        sum += 30 * (contract.getMinimumNumberOfConsecutiveWorkingDays() - numberOfConsecutiveWorkingDays);
                    else if (numberOfConsecutiveWorkingDays > contract.getMaximumNumberOfConsecutiveWorkingDays())
                        sum += 30 * (numberOfConsecutiveWorkingDays - contract.getMinimumNumberOfConsecutiveWorkingDays());


                    if (numberOfConsecutiveAssignments < Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments())
                        sum += 15 * (Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments() - numberOfConsecutiveAssignments);
                    else if (numberOfConsecutiveWorkingDays > Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments())
                        sum += 15 * (numberOfConsecutiveAssignments - Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments());

                    numberOfConsecutiveWorkingDays = 1;
                    numberOfConsecutiveAssignments = 1;
                    done = true;
                }
                else
                    numberOfConsecutiveWorkingDays++;
                if (!done) {
                    if(lastShift == "None"){
                        numberOfConsecutiveAssignments = 1;}
                    else if(lastShift != turn->getShiftType()->getId()) {

                        if (numberOfConsecutiveAssignments < Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments())
                            sum += 15 * (Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments() - numberOfConsecutiveAssignments);
                        else if (numberOfConsecutiveWorkingDays > Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments())
                            sum += 15 * (numberOfConsecutiveAssignments - Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments());

                        numberOfConsecutiveAssignments = 1;
                    }
                    else numberOfConsecutiveAssignments++;
                }

                lastShift = turn->getShiftType()->getId();
                day = turn->getDay();
                done = false;

                turnN++;
                if(turnN == nurse.second->getTurns().size())
                {
                    if(turn->getDay() != 6)
                    {
                        if (numberOfConsecutiveWorkingDays < contract.getMinimumNumberOfConsecutiveWorkingDays())
                            sum += 30 * (contract.getMinimumNumberOfConsecutiveWorkingDays() - numberOfConsecutiveWorkingDays);
                        else if (numberOfConsecutiveWorkingDays > contract.getMaximumNumberOfConsecutiveWorkingDays())
                            sum += 30 * (numberOfConsecutiveWorkingDays - contract.getMinimumNumberOfConsecutiveWorkingDays());


                        if (numberOfConsecutiveAssignments < Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments())
                            sum += 15 * (Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments() - numberOfConsecutiveAssignments);
                        else if (numberOfConsecutiveWorkingDays > Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments())
                            sum += 15 * (numberOfConsecutiveAssignments - Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments());
                    }

                }
            }
        }
    return sum;
}